

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

int osssb_add_byte(osgen_txtwin_t *win,char c)

{
  char *pcVar1;
  char in_SIL;
  osgen_txtwin_t *in_RDI;
  char *nxtfree;
  int local_4;
  
  if (((in_RDI->base).flags & 2) == 0) {
    pcVar1 = ossadvsp(in_RDI,in_RDI->txtfree);
    if ((pcVar1 == in_RDI->line_ptr[in_RDI->first_line]) && (((in_RDI->base).flags & 1) == 0)) {
      *in_RDI->txtfree = '\0';
      (in_RDI->base).flags = (in_RDI->base).flags | 2;
      local_4 = 0;
    }
    else {
      *in_RDI->txtfree = in_SIL;
      in_RDI->txtfree = pcVar1;
      if (in_RDI->txtfree == in_RDI->line_ptr[in_RDI->first_line]) {
        in_RDI->first_line = in_RDI->first_line + 1;
        if (in_RDI->line_ptr_cnt <= in_RDI->first_line) {
          in_RDI->first_line = 0;
        }
        in_RDI->line_count = in_RDI->line_count - 1;
        (in_RDI->base).y = (in_RDI->base).y + -1;
        if ((in_RDI->base).scrolly == 0) {
          (in_RDI->base).flags = (in_RDI->base).flags | 4;
        }
        else {
          (in_RDI->base).scrolly = (in_RDI->base).scrolly + -1;
        }
      }
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int osssb_add_byte(osgen_txtwin_t *win, char c)
{
    char *nxtfree;

    /* if the window is full, indicate failure */
    if ((win->base.flags & OSGEN_FULL) != 0)
        return FALSE;

    /* 
     *   If there's no room, and we're not in auto-vscroll mode, simply
     *   discard the text.  A window that is not in auto-vscroll mode is
     *   designed to always show the oldest text, so if we overflow the
     *   buffer, then we want to start discarding the newest test.  
     */
    nxtfree = ossadvsp(win, win->txtfree);
    if (nxtfree == win->line_ptr[win->first_line]
        && !(win->base.flags & OSGEN_AUTO_VSCROLL))
    {
        /* 
         *   The buffer is full, and we're not in auto-vscroll mode -
         *   discard the new text.  Before we do, set the current last byte
         *   to null, to terminate the current line at this point.  
         */
        *win->txtfree = '\0';

        /* set the 'full' flag */
        win->base.flags |= OSGEN_FULL;

        /* indicate failure */
        return FALSE;
    }

    /* add the character to the buffer */
    *win->txtfree = c;

    /* advance the free pointer */
    win->txtfree = nxtfree;

    /* 
     *   if the free pointer has just collided with the start of the oldest
     *   line, delete the oldest line 
     */
    if (win->txtfree == win->line_ptr[win->first_line])
    {
        /* delete the oldest line to make room for the new data */
        win->first_line++;
        if (win->first_line >= win->line_ptr_cnt)
            win->first_line = 0;

        /* we have one less line in the buffer */
        win->line_count--;

        /* adjust our document cooordinates for the loss of a line */
        win->base.y--;

        /* 
         *   Adjust the scrolling position for the loss of a line.  If the
         *   window is displaying the line that we just deleted (i.e., the
         *   window's vertical scroll offset is zero), we must redraw the
         *   window; otherwise, the change won't affect the display, so we
         *   can merely adjust the scrolling offset.  
         */
        if (win->base.scrolly == 0)
            win->base.flags |= OSGEN_DEFER_REDRAW;
        else
            win->base.scrolly--;
    }

    /* we successfully added the byte */
    return TRUE;
}